

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O3

LY_ERR ly_parse_uint(char *val_str,size_t val_len,uint64_t max,int base,uint64_t *ret)

{
  char cVar1;
  char *in_RAX;
  char *pcVar2;
  int *piVar3;
  ulonglong uVar4;
  ushort **ppuVar5;
  LY_ERR LVar6;
  char *local_38;
  
  if (val_str == (char *)0x0) {
    pcVar2 = "val_str";
  }
  else if (*val_str == '\0') {
    pcVar2 = "val_str[0]";
  }
  else {
    if (val_len != 0) {
      local_38 = in_RAX;
      pcVar2 = strndup(val_str,val_len);
      if (pcVar2 == (char *)0x0) {
        return LY_EMEM;
      }
      piVar3 = __errno_location();
      *piVar3 = 0;
      uVar4 = strtoull(pcVar2,&local_38,base);
      LVar6 = LY_EVALID;
      if (((local_38 == pcVar2 || *piVar3 != 0) || (LVar6 = LY_EDENIED, max < uVar4)) ||
         ((uVar4 != 0 && (*pcVar2 == '-')))) {
        free(pcVar2);
        return LVar6;
      }
      cVar1 = *local_38;
      if ((long)cVar1 == 0) {
        free(pcVar2);
      }
      else {
        ppuVar5 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
          free(pcVar2);
          return LY_EVALID;
        }
        do {
          local_38 = local_38 + 1;
          cVar1 = *local_38;
        } while ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) != 0);
        free(pcVar2);
        if (cVar1 != '\0') {
          return LY_EVALID;
        }
      }
      *ret = uVar4;
      return LY_SUCCESS;
    }
    pcVar2 = "val_len";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"ly_parse_uint");
  return LY_EINVAL;
}

Assistant:

LY_ERR
ly_parse_uint(const char *val_str, size_t val_len, uint64_t max, int base, uint64_t *ret)
{
    LY_ERR rc = LY_SUCCESS;
    char *ptr, *str;
    uint64_t u;

    LY_CHECK_ARG_RET(NULL, val_str, val_str[0], val_len, LY_EINVAL);

    /* duplicate the value to avoid accessing following bytes */
    str = strndup(val_str, val_len);
    LY_CHECK_RET(!str, LY_EMEM);

    /* parse the value */
    errno = 0;
    u = strtoull(str, &ptr, base);
    if (errno || (ptr == str)) {
        /* invalid string */
        rc = LY_EVALID;
    } else if ((u > max) || (u && (str[0] == '-'))) {
        /* invalid number */
        rc = LY_EDENIED;
    } else if (*ptr) {
        while (isspace(*ptr)) {
            ++ptr;
        }
        if (*ptr) {
            /* invalid characters after some number */
            rc = LY_EVALID;
        }
    }

    /* cleanup */
    free(str);
    if (!rc) {
        *ret = u;
    }
    return rc;
}